

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O2

void __thiscall
ritobin::io::text_write_impl::BinTextWriter::write_type_visit(BinTextWriter *this,Map *value)

{
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  
  TextWriter::write(&this->writer,0x86,in_RDX,in_RCX);
  TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])0x1319c7);
  TextWriter::write(&this->writer,(uint)value->keyType,__buf,in_RCX);
  TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])",");
  TextWriter::write(&this->writer,(uint)value->valueType,__buf_00,in_RCX);
  TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])0x13075f);
  return;
}

Assistant:

void write_type_visit(Map const& value) noexcept {
            writer.write(value.type);
            writer.write_raw("[");
            writer.write(value.keyType);
            writer.write_raw(",");
            writer.write(value.valueType);
            writer.write_raw("]");
        }